

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

_Bool ec_ed_alg_and_curve_by_bits(int bits,ec_curve **curve,ssh_keyalg **alg)

{
  ec_curve *peVar1;
  ssh_keyalg **alg_local;
  ec_curve **curve_local;
  int bits_local;
  
  if (bits - 0xffU < 2) {
    *alg = &ssh_ecdsa_ed25519;
  }
  else {
    if (bits != 0x1c0) {
      return false;
    }
    *alg = &ssh_ecdsa_ed448;
  }
  peVar1 = (ec_curve *)(**(*alg)->extra)();
  *curve = peVar1;
  return true;
}

Assistant:

bool ec_ed_alg_and_curve_by_bits(
    int bits, const struct ec_curve **curve, const ssh_keyalg **alg)
{
    switch (bits) {
      case 255: case 256: *alg = &ssh_ecdsa_ed25519; break;
      case 448: *alg = &ssh_ecdsa_ed448; break;
      default: return false;
    }
    *curve = ((struct ecsign_extra *)(*alg)->extra)->curve();
    return true;
}